

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

int ReadAperiodicity(char *filename,double **aperiodicity)

{
  int iVar1;
  int local_38;
  int local_34;
  int i;
  int number_of_dimensions;
  int fft_size;
  int number_of_frames;
  FILE *fp;
  double **aperiodicity_local;
  char *filename_local;
  
  fp = (FILE *)aperiodicity;
  aperiodicity_local = (double **)filename;
  _fft_size = fopen(filename,"rb");
  if (_fft_size == (FILE *)0x0) {
    printf("File cannot be opened.\n");
    filename_local._4_4_ = 0;
  }
  else {
    iVar1 = anon_unknown.dwarf_a4a0::CheckHeader((FILE *)_fft_size,"AP  ");
    if (iVar1 == 0) {
      filename_local._4_4_ = 0;
    }
    else {
      anon_unknown.dwarf_a4a0::LoadParameters((FILE *)_fft_size,&number_of_dimensions,&i,&local_34);
      for (local_38 = 0; local_38 < number_of_dimensions; local_38 = local_38 + 1) {
        fread(*(void **)(fp + (long)local_38 * 8),8,(long)local_34,_fft_size);
      }
      fclose(_fft_size);
      filename_local._4_4_ = 1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int ReadAperiodicity(const char *filename, double **aperiodicity) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "AP  ") == 0) return 0;

  // Parameters
  int number_of_frames, fft_size, number_of_dimensions;
  LoadParameters(fp, &number_of_frames, &fft_size, &number_of_dimensions);

  // Data
  for (int i = 0; i < number_of_frames; ++i)
    fread(aperiodicity[i], 8, number_of_dimensions, fp);

  fclose(fp);
  return 1;
}